

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

boolean create_particular(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  permonst *ptr;
  monst *mtmp;
  long lVar5;
  int iVar6;
  int iVar7;
  boolean bVar8;
  bool bVar9;
  char buf [256];
  int local_14c;
  int local_148;
  char local_138 [264];
  
  local_14c = 0x3d;
  iVar7 = 5;
  do {
    iVar6 = (int)urole.malenum;
    getlin("Create what kind of monster? [type the name or symbol]",local_138);
    pcVar3 = mungspaces(local_138);
    if (*pcVar3 == '\x1b') {
      return '\0';
    }
    lVar5 = 5;
    iVar1 = strncasecmp(pcVar3,"tame ",5);
    if (iVar1 == 0) {
      local_148 = 0;
LAB_0023269e:
      bVar9 = false;
    }
    else {
      lVar5 = 9;
      iVar2 = strncasecmp(pcVar3,"peaceful ",9);
      if (iVar2 == 0) {
        local_148 = 1;
        goto LAB_0023269e;
      }
      iVar2 = strncasecmp(pcVar3,"hostile ",8);
      bVar9 = iVar2 == 0;
      lVar5 = (ulong)bVar9 << 3;
      local_148 = 0;
    }
    pcVar3 = pcVar3 + lVar5;
    sVar4 = strlen(pcVar3);
    if (sVar4 == 1) {
      local_14c = def_char_to_monclass(*pcVar3);
      if ((char)local_14c != '=') {
LAB_00232702:
        lVar5 = 0xfa;
        if (iVar6 < 0x11c) {
          if ((iVar6 != 0x7f) && (iVar6 != 0x11a)) {
LAB_00232741:
            lVar5 = (long)iVar6;
          }
        }
        else if ((iVar6 != 0x11c) && (iVar6 != 0x11f)) {
          if (iVar6 != 0x158) goto LAB_00232741;
          lVar5 = 0x76;
        }
        if (multi < 0) {
          return '\0';
        }
        ptr = mons + lVar5;
        iVar7 = -1;
        bVar8 = '\0';
        break;
      }
    }
    else {
      iVar6 = name_to_mon(pcVar3);
      if (-1 < iVar6) goto LAB_00232702;
    }
    pline("I\'ve never heard of such monsters.");
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      pline("That\'s enough tries!");
      return '\0';
    }
  } while( true );
LAB_00232792:
  if ((char)local_14c != '=') {
    ptr = mkclass(&u.uz,(char)local_14c,0);
  }
  if (iVar1 == 0) {
    mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,4);
    if (mtmp != (monst *)0x0) {
      initedog(mtmp);
      goto LAB_0023281b;
    }
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
    if ((mtmp != (monst *)0x0 & (bVar9 | (byte)local_148)) == 1) {
      mtmp->mtame = '\0';
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | local_148 << 0x16;
LAB_0023281b:
      set_malign(mtmp);
    }
  }
  if (mtmp != (monst *)0x0) {
    bVar8 = '\x01';
  }
  iVar7 = iVar7 + 1;
  if (multi <= iVar7) {
    return bVar8;
  }
  goto LAB_00232792;
}

Assistant:

boolean create_particular(void)
{
	char buf[BUFSZ], *bufp, monclass = MAXMCLASSES;
	int which, tries, i;
	const struct permonst *whichpm;
	struct monst *mtmp;
	boolean madeany = FALSE;
	boolean maketame, makepeaceful, makehostile;

	tries = 0;
	do {
	    which = urole.malenum;	/* an arbitrary index into mons[] */
	    maketame = makepeaceful = makehostile = FALSE;
	    getlin("Create what kind of monster? [type the name or symbol]",
		   buf);
	    bufp = mungspaces(buf);
	    if (*bufp == '\033') return FALSE;
	    /* allow the initial disposition to be specified */
	    if (!strncmpi(bufp, "tame ", 5)) {
		bufp += 5;
		maketame = TRUE;
	    } else if (!strncmpi(bufp, "peaceful ", 9)) {
		bufp += 9;
		makepeaceful = TRUE;
	    } else if (!strncmpi(bufp, "hostile ", 8)) {
		bufp += 8;
		makehostile = TRUE;
	    }
	    /* decide whether a valid monster was chosen */
	    if (strlen(bufp) == 1) {
		monclass = def_char_to_monclass(*bufp);
		if (monclass != MAXMCLASSES) break;	/* got one */
	    } else {
		which = name_to_mon(bufp);
		if (which >= LOW_PM) break;		/* got one */
	    }
	    /* no good; try again... */
	    pline("I've never heard of such monsters.");
	} while (++tries < 5);

	if (tries == 5) {
	    pline("That's enough tries!");
	} else {
	    cant_create(&which, FALSE);
	    whichpm = &mons[which];
	    for (i = 0; i <= multi; i++) {
		if (monclass != MAXMCLASSES)
		    whichpm = mkclass(&u.uz, monclass, 0);
		if (maketame) {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, MM_EDOG);
		    if (mtmp) {
			initedog(mtmp);
			set_malign(mtmp);
		    }
		} else {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, NO_MM_FLAGS);
		    if ((makepeaceful || makehostile) && mtmp) {
			mtmp->mtame = 0;	/* sanity precaution */
			mtmp->mpeaceful = makepeaceful ? 1 : 0;
			set_malign(mtmp);
		    }
		}
		if (mtmp) madeany = TRUE;
	    }
	}
	return madeany;
}